

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group.cxx
# Opt level: O1

int * __thiscall Fl_Group::sizes(Fl_Group *this)

{
  int iVar1;
  Fl_Group *pFVar2;
  Fl_Widget *pFVar3;
  int iVar4;
  int *piVar5;
  Fl_Widget ***pppFVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  
  if (this->sizes_ == (int *)0x0) {
    iVar1 = this->children_;
    iVar4 = iVar1 * 4 + 8;
    uVar10 = 0xffffffffffffffff;
    if (-1 < iVar4) {
      uVar10 = (long)iVar4 * 4;
    }
    piVar5 = (int *)operator_new__(uVar10);
    this->sizes_ = piVar5;
    if ((this->super_Fl_Widget).type_ < 0xf0) {
      *piVar5 = (this->super_Fl_Widget).x_;
      piVar5[2] = (this->super_Fl_Widget).y_;
    }
    else {
      piVar5[2] = 0;
      *piVar5 = 0;
    }
    iVar4 = *piVar5;
    iVar8 = (this->super_Fl_Widget).w_ + iVar4;
    piVar5[1] = iVar8;
    iVar9 = (this->super_Fl_Widget).h_ + piVar5[2];
    piVar5[3] = iVar9;
    piVar5[4] = iVar4;
    piVar5[5] = iVar8;
    piVar5[6] = piVar5[2];
    piVar5[7] = iVar9;
    pFVar2 = (Fl_Group *)this->resizable_;
    if (pFVar2 != this && pFVar2 != (Fl_Group *)0x0) {
      iVar8 = (pFVar2->super_Fl_Widget).x_;
      if (iVar4 < iVar8) {
        piVar5[4] = iVar8;
      }
      iVar8 = iVar8 + (pFVar2->super_Fl_Widget).w_;
      if (iVar8 < piVar5[1]) {
        piVar5[5] = iVar8;
      }
      iVar4 = (pFVar2->super_Fl_Widget).y_;
      if (piVar5[2] < iVar4) {
        piVar5[6] = iVar4;
      }
      iVar4 = iVar4 + (pFVar2->super_Fl_Widget).h_;
      if (iVar4 < piVar5[3]) {
        piVar5[7] = iVar4;
      }
    }
    if (iVar1 != 0) {
      if (iVar1 < 2) {
        pppFVar6 = &this->array_;
      }
      else {
        pppFVar6 = (Fl_Widget ***)this->array_;
      }
      piVar5 = piVar5 + 8;
      lVar7 = 0;
      do {
        pFVar3 = (Fl_Widget *)pppFVar6[lVar7];
        *piVar5 = pFVar3->x_;
        piVar5[1] = pFVar3->w_ + pFVar3->x_;
        piVar5[2] = pFVar3->y_;
        piVar5[3] = pFVar3->h_ + pFVar3->y_;
        lVar7 = lVar7 + 1;
        piVar5 = piVar5 + 4;
      } while (iVar1 != (int)lVar7);
    }
  }
  return this->sizes_;
}

Assistant:

int* Fl_Group::sizes() {
  if (!sizes_) {
    int* p = sizes_ = new int[4*(children_+2)];
    // first thing in sizes array is the group's size:
    if (type() < FL_WINDOW) {p[0] = x(); p[2] = y();} else {p[0] = p[2] = 0;}
    p[1] = p[0]+w(); p[3] = p[2]+h();
    // next is the resizable's size:
    p[4] = p[0]; // init to the group's size
    p[5] = p[1];
    p[6] = p[2];
    p[7] = p[3];
    Fl_Widget* r = resizable();
    if (r && r != this) { // then clip the resizable to it
      int t;
      t = r->x(); if (t > p[0]) p[4] = t;
      t +=r->w(); if (t < p[1]) p[5] = t;
      t = r->y(); if (t > p[2]) p[6] = t;
      t +=r->h(); if (t < p[3]) p[7] = t;
    }
    // next is all the children's sizes:
    p += 8;
    Fl_Widget*const* a = array();
    for (int i=children_; i--;) {
      Fl_Widget* o = *a++;
      *p++ = o->x();
      *p++ = o->x()+o->w();
      *p++ = o->y();
      *p++ = o->y()+o->h();
    }
  }
  return sizes_;
}